

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

CreatePegInAddressResponse * __thiscall
cfd::js::api::json::CreatePegInAddressResponse::GetTweakFedpegscriptString_abi_cxx11_
          (CreatePegInAddressResponse *this,CreatePegInAddressResponse *obj)

{
  CreatePegInAddressResponse *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->tweak_fedpegscript_);
  return this;
}

Assistant:

static std::string GetTweakFedpegscriptString(  // line separate
      const CreatePegInAddressResponse& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.tweak_fedpegscript_);
  }